

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

size_t ecMulA_deep(size_t n,size_t ec_d,size_t ec_deep,size_t m)

{
  size_t sVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t naf_count;
  size_t naf_width;
  
  sVar1 = ecNAFWidth(in_RCX << 6);
  return (in_RCX * 2 + 1) * 8 + in_RSI * in_RDI * 8 +
         in_RSI * in_RDI * (1L << ((char)sVar1 - 2U & 0x3f)) * 8 + in_RDX;
}

Assistant:

size_t ecMulA_deep(size_t n, size_t ec_d, size_t ec_deep, size_t m)
{
	const size_t naf_width = ecNAFWidth(B_OF_W(m));
	const size_t naf_count = SIZE_1 << (naf_width - 2);
	return O_OF_W(2 * m + 1) + 
		O_OF_W(ec_d * n) + 
		O_OF_W(ec_d * n * naf_count) + 
		ec_deep;
}